

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_timeout.c
# Opt level: O3

void ares_timeval_remaining(ares_timeval_t *remaining,ares_timeval_t *now,ares_timeval_t *tout)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  
  remaining->sec = 0;
  *(undefined8 *)&remaining->usec = 0;
  lVar3 = tout->sec - now->sec;
  if (now->sec <= tout->sec) {
    uVar2 = tout->usec;
    uVar1 = now->usec;
    if (lVar3 != 0 || uVar1 <= uVar2) {
      remaining->sec = lVar3;
      if (uVar2 < uVar1) {
        remaining->sec = lVar3 + -1;
        uVar2 = uVar2 + 1000000;
      }
      remaining->usec = uVar2 - uVar1;
    }
  }
  return;
}

Assistant:

void ares_timeval_remaining(ares_timeval_t       *remaining,
                            const ares_timeval_t *now,
                            const ares_timeval_t *tout)
{
  memset(remaining, 0, sizeof(*remaining));

  /* Expired! */
  if (tout->sec < now->sec ||
      (tout->sec == now->sec && tout->usec < now->usec)) {
    return;
  }

  remaining->sec = tout->sec - now->sec;
  if (tout->usec < now->usec) {
    remaining->sec  -= 1;
    remaining->usec  = (tout->usec + 1000000) - now->usec;
  } else {
    remaining->usec = tout->usec - now->usec;
  }
}